

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O1

int Fax3Decode1D(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  undefined6 in_register_0000000a;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  char *pcVar19;
  long lVar20;
  byte *pbVar21;
  uint uVar22;
  uint *puVar23;
  int iVar24;
  int iVar25;
  bool bVar26;
  int local_84;
  uint *local_58;
  
  puVar5 = tif->tif_data;
  if (occ % *(long *)(puVar5 + 8) != 0) {
    TIFFErrorExtR(tif,"Fax3Decode1D","Fractional scanlines cannot be read",
                  CONCAT62(in_register_0000000a,s));
    return -1;
  }
  uVar22 = *(uint *)(puVar5 + 0x48);
  iVar24 = *(int *)(puVar5 + 0x4c);
  local_84 = *(int *)(puVar5 + 0x50);
  pbVar18 = tif->tif_rawcp;
  if (occ < 1) {
LAB_0029efde:
    *(int *)(puVar5 + 0x4c) = iVar24;
    *(uint *)(puVar5 + 0x48) = uVar22;
    *(int *)(puVar5 + 0x50) = local_84;
    tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar18));
    tif->tif_rawcp = pbVar18;
    return 1;
  }
  uVar3 = *(uint *)(puVar5 + 0x10);
  uVar14 = (ulong)uVar3;
  lVar6 = *(long *)(puVar5 + 0x40);
  pbVar21 = pbVar18 + tif->tif_rawcc;
  puVar7 = *(uint **)(puVar5 + 0x78);
LAB_0029ea85:
  pbVar17 = pbVar18;
  local_58 = puVar7;
  if (local_84 == 0) {
    while( true ) {
      pbVar17 = pbVar18;
      iVar25 = iVar24;
      if (iVar24 < 0xb) {
        if (pbVar18 < pbVar21) {
          pbVar17 = pbVar18 + 1;
          uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar18) << ((byte)iVar24 & 0x1f);
          iVar25 = iVar24 + 8;
          if (iVar24 < 3) {
            if (pbVar17 < pbVar21) {
              uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)pbVar18[1]) <<
                                ((byte)(iVar24 + 8) & 0x1f);
              pbVar17 = pbVar18 + 2;
              iVar25 = iVar24 + 0x10;
            }
            else {
              iVar25 = 0xb;
            }
          }
        }
        else {
          iVar25 = 0xb;
          if (iVar24 == 0) goto LAB_0029f010;
        }
      }
      iVar24 = iVar25;
      if ((uVar22 & 0x7ff) == 0) break;
      iVar24 = iVar24 + -1;
      uVar22 = uVar22 >> 1;
      pbVar18 = pbVar17;
    }
  }
  while( true ) {
    pbVar18 = pbVar17;
    if (iVar24 < 8) {
      if (pbVar17 < pbVar21) {
        uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar17) << ((byte)iVar24 & 0x1f);
        iVar24 = iVar24 + 8;
        pbVar18 = pbVar17 + 1;
      }
      else {
        bVar26 = iVar24 == 0;
        iVar24 = 8;
        if (bVar26) goto LAB_0029f010;
      }
    }
    if ((char)uVar22 != '\0') break;
    iVar24 = iVar24 + -8;
    uVar22 = uVar22 >> 8;
    pbVar17 = pbVar18;
  }
  uVar15 = uVar22 & 1;
  while (uVar15 == 0) {
    iVar24 = iVar24 + -1;
    uVar15 = uVar22 & 2;
    uVar22 = uVar22 >> 1;
  }
  iVar24 = iVar24 + -1;
  uVar22 = uVar22 >> 1;
  uVar16 = 0;
LAB_0029eb70:
  uVar15 = 0;
  pbVar17 = pbVar18;
  do {
    pbVar18 = pbVar17;
    iVar25 = iVar24;
    puVar23 = local_58;
    if (iVar24 < 0xc) {
      if (pbVar17 < pbVar21) {
        pbVar18 = pbVar17 + 1;
        uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar17) << ((byte)iVar24 & 0x1f);
        iVar25 = iVar24 + 8;
        if (iVar24 < 4) {
          if (pbVar18 < pbVar21) {
            uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)pbVar17[1]) << ((byte)iVar25 & 0x1f);
            iVar25 = iVar24 + 0x10;
            pbVar18 = pbVar17 + 2;
          }
          else {
            iVar25 = 0xc;
          }
        }
      }
      else {
        iVar25 = 0xc;
        if (iVar24 == 0) goto LAB_0029f0d3;
      }
    }
    uVar9 = uVar22 & 0xfff;
    uVar22 = uVar22 >> (TIFFFaxWhiteTable[uVar9].Width & 0x1f);
    iVar24 = iVar25 - (uint)TIFFFaxWhiteTable[uVar9].Width;
    pbVar17 = pbVar18;
    switch(TIFFFaxWhiteTable[uVar9].State) {
    case '\a':
      goto switchD_0029ec0a_caseD_7;
    default:
      goto LAB_0029ed51;
    case '\t':
    case '\v':
      uVar16 = (ulong)((int)uVar16 + TIFFFaxWhiteTable[uVar9].Param);
      uVar15 = uVar15 + TIFFFaxWhiteTable[uVar9].Param;
      break;
    case '\f':
      local_84 = 1;
      goto LAB_0029eddd;
    }
  } while( true );
LAB_0029f010:
  if (uVar3 == 0) goto LAB_0029f18e;
  pcVar19 = "tile";
  puVar12 = &tif->tif_curtile;
  if ((tif->tif_flags >> 10 & 1) == 0) {
    pcVar19 = "strip";
    puVar12 = &tif->tif_curstrip;
  }
  TIFFWarningExtR(tif,"Fax3Decode1D","%s at line %u of %s %u (got %u, expected %u)","Premature EOL",
                  (ulong)*(uint *)(puVar5 + 0x98),pcVar19,(ulong)*puVar12,0,uVar14);
  if ((int)uVar3 < 1) {
    if (-1 < (int)uVar3) goto LAB_0029f18e;
    if ((*(int *)(puVar5 + 0x68) != 0) && (*puVar7 = uVar3, 1 < *(uint *)(puVar5 + 0x68))) {
      puVar7[1] = 0;
      local_58 = puVar7 + 2;
      goto LAB_0029f18e;
    }
  }
  else if (*(int *)(puVar5 + 0x68) != 0) {
    *puVar7 = uVar3;
    local_58 = puVar7 + 1;
    goto LAB_0029f18e;
  }
  bVar26 = (tif->tif_flags >> 10 & 1) == 0;
  pcVar19 = "tile";
  if (bVar26) {
    pcVar19 = "strip";
  }
  uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
  puVar12 = &tif->tif_curtile;
  if (bVar26) {
    puVar12 = &tif->tif_curstrip;
  }
  uVar16 = (ulong)*puVar12;
  goto LAB_0029f42e;
switchD_0029ec0a_caseD_7:
  if (local_58 < puVar7 + *(uint *)(puVar5 + 0x68)) {
    uVar4 = TIFFFaxWhiteTable[uVar9].Param;
    uVar9 = uVar15 + uVar4;
    puVar23 = local_58 + 1;
    *local_58 = uVar9;
    uVar15 = (int)uVar16 + uVar4;
    uVar16 = (ulong)uVar15;
    if ((int)uVar3 <= (int)uVar15) goto LAB_0029efcf;
    uVar15 = 0;
    while( true ) {
      pbVar18 = pbVar17;
      iVar25 = iVar24;
      if (iVar24 < 0xd) {
        if (pbVar17 < pbVar21) {
          pbVar18 = pbVar17 + 1;
          uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar17) << ((byte)iVar24 & 0x1f);
          iVar25 = iVar24 + 8;
          if (iVar24 < 5) {
            if (pbVar18 < pbVar21) {
              uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)pbVar17[1]) << ((byte)iVar25 & 0x1f);
              iVar25 = iVar24 + 0x10;
              pbVar18 = pbVar17 + 2;
            }
            else {
              iVar25 = 0xd;
            }
          }
        }
        else {
          iVar25 = 0xd;
          if (iVar24 == 0) goto LAB_0029f0d3;
        }
      }
      uVar10 = uVar22 & 0x1fff;
      uVar22 = uVar22 >> (TIFFFaxBlackTable[uVar10].Width & 0x1f);
      iVar24 = iVar25 - (uint)TIFFFaxBlackTable[uVar10].Width;
      bVar2 = TIFFFaxBlackTable[uVar10].State;
      if (1 < bVar2 - 10) break;
      uVar16 = (ulong)((int)uVar16 + TIFFFaxBlackTable[uVar10].Param);
      uVar15 = uVar15 + TIFFFaxBlackTable[uVar10].Param;
      pbVar17 = pbVar18;
    }
    if (bVar2 == 0xc) {
      local_84 = 1;
      goto LAB_0029eddd;
    }
    if (bVar2 != 8) {
LAB_0029ed51:
      bVar26 = (tif->tif_flags >> 10 & 1) == 0;
      pcVar19 = "tile";
      if (bVar26) {
        pcVar19 = "strip";
      }
      puVar12 = &tif->tif_curtile;
      if (bVar26) {
        puVar12 = &tif->tif_curstrip;
      }
      local_84 = 0;
      TIFFErrorExtR(tif,"Fax3Decode1D","Bad code word at line %u of %s %u (x %u)",
                    (ulong)*(uint *)(puVar5 + 0x98),pcVar19,(ulong)*puVar12,uVar16);
      goto LAB_0029eddd;
    }
    if (puVar23 < puVar7 + *(uint *)(puVar5 + 0x68)) {
      uVar4 = TIFFFaxBlackTable[uVar10].Param;
      uVar15 = uVar15 + uVar4;
      puVar23 = local_58 + 2;
      local_58[1] = uVar15;
      uVar10 = (int)uVar16 + uVar4;
      uVar16 = (ulong)uVar10;
      if ((int)uVar3 <= (int)uVar10) goto LAB_0029efcf;
      if (uVar15 != 0 || uVar9 != 0) {
        local_58 = puVar23;
      }
      goto LAB_0029eb70;
    }
  }
  uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
  bVar26 = (tif->tif_flags >> 10 & 1) == 0;
  pcVar19 = "tile";
  if (bVar26) {
    pcVar19 = "strip";
  }
  puVar12 = &tif->tif_curtile;
  if (bVar26) {
    puVar12 = &tif->tif_curstrip;
  }
  uVar16 = (ulong)*puVar12;
  goto LAB_0029f42e;
LAB_0029f0d3:
  local_58 = puVar23;
  puVar12 = &tif->tif_curtile;
  puVar1 = &tif->tif_curstrip;
  pcVar19 = "tile";
  puVar11 = puVar12;
  if ((tif->tif_flags >> 10 & 1) == 0) {
    pcVar19 = "strip";
    puVar11 = puVar1;
  }
  local_84 = 0;
  TIFFWarningExtR(tif,"Fax3Decode1D","Premature EOF at line %u of %s %u (x %u)",
                  (ulong)*(uint *)(puVar5 + 0x98),pcVar19,(ulong)*puVar11,uVar16);
  if (uVar15 != 0) {
    if (puVar7 + *(uint *)(puVar5 + 0x68) <= local_58) {
      bVar26 = (tif->tif_flags >> 10 & 1) == 0;
      pcVar19 = "tile";
      if (bVar26) {
        pcVar19 = "strip";
      }
      uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
      if (bVar26) {
        puVar12 = puVar1;
      }
      uVar16 = (ulong)*puVar12;
      goto LAB_0029f42e;
    }
    *local_58 = uVar15;
    local_58 = local_58 + 1;
  }
  uVar15 = (uint)uVar16;
  if (uVar15 == uVar3) goto LAB_0029f18e;
  bVar26 = (tif->tif_flags >> 10 & 1) == 0;
  pcVar19 = "tile";
  if (bVar26) {
    pcVar19 = "strip";
  }
  puVar11 = puVar12;
  if (bVar26) {
    puVar11 = puVar1;
  }
  pcVar13 = "Line length mismatch";
  if (uVar15 < uVar3) {
    pcVar13 = "Premature EOL";
  }
  TIFFWarningExtR(tif,"Fax3Decode1D","%s at line %u of %s %u (got %u, expected %u)",pcVar13,
                  (ulong)*(uint *)(puVar5 + 0x98),pcVar19,(ulong)*puVar11,uVar16,uVar14);
  bVar26 = (int)uVar3 < (int)uVar15;
  if (((int)uVar15 <= (int)uVar3) || (local_58 <= puVar7)) goto LAB_0029f323;
  goto LAB_0029f260;
LAB_0029efcf:
  uVar15 = 0;
  local_84 = 0;
LAB_0029eddd:
  if (uVar15 != 0) {
    if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23) {
      uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
      bVar26 = (tif->tif_flags >> 10 & 1) == 0;
      pcVar19 = "tile";
      if (bVar26) {
        pcVar19 = "strip";
      }
      puVar12 = &tif->tif_curtile;
      if (bVar26) {
        puVar12 = &tif->tif_curstrip;
      }
      uVar16 = (ulong)*puVar12;
      goto LAB_0029f42e;
    }
    *puVar23 = uVar15;
    puVar23 = puVar23 + 1;
  }
  uVar15 = (uint)uVar16;
  if (uVar15 != uVar3) {
    pcVar19 = "tile";
    puVar12 = &tif->tif_curtile;
    if ((tif->tif_flags >> 10 & 1) == 0) {
      pcVar19 = "strip";
      puVar12 = &tif->tif_curstrip;
    }
    pcVar13 = "Line length mismatch";
    if (uVar15 < uVar3) {
      pcVar13 = "Premature EOL";
    }
    TIFFWarningExtR(tif,"Fax3Decode1D","%s at line %u of %s %u (got %u, expected %u)",pcVar13,
                    (ulong)*(uint *)(puVar5 + 0x98),pcVar19,(ulong)*puVar12,uVar16,uVar14);
    while( true ) {
      iVar25 = (int)uVar16;
      if (((int)uVar15 <= (int)uVar3) || (puVar23 <= puVar7)) break;
      puVar23 = puVar23 + -1;
      uVar15 = iVar25 - *puVar23;
      uVar16 = (ulong)uVar15;
    }
    if ((int)uVar3 <= iVar25) {
      if ((int)uVar3 < (int)uVar15) {
        if ((puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23) ||
           (*puVar23 = uVar3, puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23 + 1)) goto LAB_0029f43a;
        puVar23[1] = 0;
        puVar23 = puVar23 + 2;
      }
      goto LAB_0029ef69;
    }
    if (iVar25 < 1) {
      iVar25 = 0;
    }
    if (((int)puVar23 - (int)puVar7 & 4U) != 0) {
      if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23) goto LAB_0029f43a;
      *puVar23 = 0;
      puVar23 = puVar23 + 1;
    }
    if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23) {
LAB_0029f43a:
      bVar26 = (tif->tif_flags >> 10 & 1) == 0;
      pcVar19 = "tile";
      if (bVar26) {
        pcVar19 = "strip";
      }
      uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
      puVar12 = &tif->tif_curtile;
      if (bVar26) {
        puVar12 = &tif->tif_curstrip;
      }
      uVar16 = (ulong)*puVar12;
      goto LAB_0029f42e;
    }
    *puVar23 = uVar3 - iVar25;
    puVar23 = puVar23 + 1;
  }
LAB_0029ef69:
  (**(code **)(puVar5 + 0x58))(buf,puVar7,puVar23,uVar14);
  lVar8 = *(long *)(puVar5 + 8);
  buf = buf + lVar8;
  *(int *)(puVar5 + 0x98) = *(int *)(puVar5 + 0x98) + 1;
  lVar20 = occ - lVar8;
  bVar26 = occ < lVar8;
  occ = lVar20;
  if (lVar20 == 0 || bVar26) goto LAB_0029efde;
  goto LAB_0029ea85;
  while (puVar7 < local_58) {
LAB_0029f260:
    local_58 = local_58 + -1;
    uVar15 = (int)uVar16 - *local_58;
    uVar16 = (ulong)uVar15;
    bVar26 = (int)uVar3 < (int)uVar15;
    if ((int)uVar15 <= (int)uVar3) break;
  }
LAB_0029f323:
  iVar24 = (int)uVar16;
  if (iVar24 < (int)uVar3) {
    iVar25 = 0;
    if (0 < iVar24) {
      iVar25 = iVar24;
    }
    if (((int)local_58 - (int)puVar7 & 4U) == 0) {
LAB_0029f34f:
      if (local_58 < puVar7 + *(uint *)(puVar5 + 0x68)) {
        *local_58 = uVar3 - iVar25;
        local_84 = 0;
        local_58 = local_58 + 1;
        goto LAB_0029f18e;
      }
    }
    else if (local_58 < puVar7 + *(uint *)(puVar5 + 0x68)) {
      *local_58 = 0;
      local_58 = local_58 + 1;
      goto LAB_0029f34f;
    }
LAB_0029f3bf:
    bVar26 = (tif->tif_flags >> 10 & 1) == 0;
    pcVar19 = "tile";
    if (bVar26) {
      pcVar19 = "strip";
    }
    uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
    if (bVar26) {
      puVar12 = puVar1;
    }
    uVar16 = (ulong)*puVar12;
LAB_0029f42e:
    TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",uVar14,pcVar19,uVar16);
  }
  else {
    local_84 = 0;
    if (bVar26) {
      if ((puVar7 + *(uint *)(puVar5 + 0x68) <= local_58) ||
         (*local_58 = uVar3, puVar7 + *(uint *)(puVar5 + 0x68) <= local_58 + 1)) goto LAB_0029f3bf;
      local_58[1] = 0;
      local_58 = local_58 + 2;
    }
LAB_0029f18e:
    (**(code **)(puVar5 + 0x58))(buf,puVar7,local_58,uVar14);
    puVar5[0x4c] = '\0';
    puVar5[0x4d] = '\0';
    puVar5[0x4e] = '\0';
    puVar5[0x4f] = '\0';
    *(uint *)(puVar5 + 0x48) = uVar22;
    *(int *)(puVar5 + 0x50) = local_84;
    tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar17));
    tif->tif_rawcp = pbVar17;
  }
  return -1;
}

Assistant:

static int Fax3Decode1D(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE(tif, sp, "Fax3Decode1D");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    thisrun = sp->curruns;
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %" PRIu32 "\n", tif->tif_row);
        fflush(stdout);
#endif
        SYNC_EOL(EOF1D);
        EXPAND1D(EOF1Da);
        (*sp->fill)(buf, thisrun, pa, lastx);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOF1D: /* premature EOF */
        CLEANUP_RUNS();
    EOF1Da: /* premature EOF */
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (-1);
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}